

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamToolsIndex::GetOffset
          (BamToolsIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  int iVar1;
  int *piVar2;
  BamException *this_00;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  BtiReferenceEntry refEntry;
  string local_68;
  string local_48;
  
  iVar1 = region->LeftRefID;
  if ((iVar1 < 0) ||
     ((int)((ulong)((long)(this->m_indexFileSummary).
                          super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_indexFileSummary).
                         super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar1)) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamToolsIndex::GetOffset","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"invalid region requested","");
    BamException::BamException(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
  }
  local_68._M_dataplus._M_p._0_4_ = iVar1;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  local_68.field_2._8_8_ = 0;
  ReadReferenceEntry(this,(BtiReferenceEntry *)&local_68);
  piVar3 = (int *)local_68._M_string_length;
  piVar2 = (int *)local_68._M_string_length;
  if (0 < (long)(local_68.field_2._M_allocated_capacity - local_68._M_string_length)) {
    uVar7 = (local_68.field_2._M_allocated_capacity - local_68._M_string_length >> 3) *
            -0x5555555555555555;
    do {
      uVar6 = uVar7 >> 1;
      piVar2 = piVar3 + uVar6 * 6;
      if (piVar2[4] <= region->RightPosition) {
        if (region->LeftPosition < *piVar2) {
          *offset = *(int64_t *)(piVar2 + 2);
          break;
        }
        piVar3 = piVar2 + 6;
        uVar6 = ~uVar6 + uVar7;
        piVar2 = piVar3;
      }
      uVar7 = uVar6;
    } while (0 < (long)uVar6);
  }
  if (piVar2 == (int *)local_68.field_2._M_allocated_capacity) {
    bVar4 = false;
  }
  else {
    do {
      piVar5 = piVar2;
      piVar2 = piVar3;
      if (piVar5 == piVar3) goto LAB_001ab6cf;
      piVar2 = piVar5 + -6;
    } while (region->LeftPosition < piVar5[-6]);
    *offset = *(int64_t *)(piVar5 + 2);
    bVar4 = true;
    if (piVar2 == piVar3) {
LAB_001ab6cf:
      *offset = *(int64_t *)(piVar2 + 2);
      bVar4 = true;
    }
  }
  *hasAlignmentsInRegion = bVar4;
  if ((int *)local_68._M_string_length != (int *)0x0) {
    operator_delete((void *)local_68._M_string_length);
  }
  return;
}

Assistant:

void BamToolsIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion)
{

    // return false ref ID is not a valid index in file summary data
    if (region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size())
        throw BamException("BamToolsIndex::GetOffset", "invalid region requested");

    // retrieve reference index data for left bound reference
    BtiReferenceEntry refEntry(region.LeftRefID);
    ReadReferenceEntry(refEntry);

    // binary search for an overlapping block (may not be first one though)
    bool found = false;
    typedef BtiBlockVector::const_iterator BtiBlockConstIterator;
    BtiBlockConstIterator blockFirst = refEntry.Blocks.begin();
    BtiBlockConstIterator blockIter = blockFirst;
    BtiBlockConstIterator blockLast = refEntry.Blocks.end();
    std::iterator_traits<BtiBlockConstIterator>::difference_type count =
        std::distance(blockFirst, blockLast);
    std::iterator_traits<BtiBlockConstIterator>::difference_type step;
    while (count > 0) {
        blockIter = blockFirst;
        step = count / 2;
        advance(blockIter, step);

        const BtiBlock& block = (*blockIter);
        if (block.StartPosition <= region.RightPosition) {
            if (block.MaxEndPosition > region.LeftPosition) {
                offset = block.StartOffset;
                break;
            }
            blockFirst = ++blockIter;
            count -= step + 1;
        } else
            count = step;
    }

    // if we didn't search "off the end" of the blocks
    if (blockIter != blockLast) {

        // "walk back" until we've gone too far
        while (blockIter != blockFirst) {
            const BtiBlock& currentBlock = (*blockIter);

            --blockIter;
            const BtiBlock& previousBlock = (*blockIter);
            if (previousBlock.MaxEndPosition <= region.LeftPosition) {
                offset = currentBlock.StartOffset;
                found = true;
                break;
            }
        }

        // if we walked all the way to first block, just return that and let the reader's
        // region overlap parsing do the rest
        if (blockIter == blockFirst) {
            const BtiBlock& block = (*blockIter);
            offset = block.StartOffset;
            found = true;
        }
    }

    // sets to false if blocks container is empty, or if no matching block could be found
    *hasAlignmentsInRegion = found;
}